

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStore::Write<tcu::Vector<unsigned_int,4>>
          (BasicAllFormatsStore *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  GLenum type;
  GLenum GVar4;
  GLint location;
  char *src_fs;
  reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  string local_118;
  Vector<unsigned_int,_4> local_f8;
  string local_e8;
  Vector<unsigned_int,_4> local_c8;
  string local_b8;
  int local_98;
  uint local_94;
  int i;
  GLuint unit;
  GLuint texture;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  int kSize;
  string local_60;
  GLuint local_3c;
  char *pcStack_38;
  GLuint program;
  char *src_vs;
  Vector<unsigned_int,_4> *expected_value_local;
  Vector<unsigned_int,_4> *write_value_local;
  BasicAllFormatsStore *pBStack_18;
  GLenum internalformat_local;
  BasicAllFormatsStore *this_local;
  
  pcStack_38 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = write_value;
  write_value_local._4_4_ = internalformat;
  pBStack_18 = this;
  GenFS<tcu::Vector<unsigned_int,4>>(&local_60,this,internalformat,write_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  data.
  super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10;
  local_3c = GVar2;
  std::allocator<tcu::Vector<unsigned_int,_4>_>::allocator
            ((allocator<tcu::Vector<unsigned_int,_4>_> *)((long)&unit + 3));
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )&texture,0x100,(allocator<tcu::Vector<unsigned_int,_4>_> *)((long)&unit + 3));
  std::allocator<tcu::Vector<unsigned_int,_4>_>::~allocator
            ((allocator<tcu::Vector<unsigned_int,_4>_> *)((long)&unit + 3));
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),1,(GLuint *)&i);
  local_94 = 0;
  do {
    if (7 < local_94) {
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,(GLuint *)&i);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
      this_local._7_1_ = 1;
LAB_0104362e:
      std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      ~vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               *)&texture);
      return (bool)(this_local._7_1_ & 1);
    }
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,i);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
    GVar4 = write_value_local._4_4_;
    GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                      ((ShaderImageLoadStoreBase *)this);
    type = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                     ((ShaderImageLoadStoreBase *)this);
    pvVar5 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&texture,0);
    glu::CallLogWrapper::glTexImage2D
              ((CallLogWrapper *)(this + 8),0xde1,0,GVar4,0x10,0x10,0,GVar3,type,pvVar5);
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
    glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_3c);
    glu::CallLogWrapper::glBindImageTexture
              ((CallLogWrapper *)(this + 8),local_94,i,0,'\0',0,0x88b9,write_value_local._4_4_);
    glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,i);
    glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
    GVar4 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                      ((ShaderImageLoadStoreBase *)this);
    GVar3 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                      ((ShaderImageLoadStoreBase *)this);
    pvVar5 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&texture,0);
    glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0xde1,0,GVar4,GVar3,pvVar5);
    for (local_98 = 0; local_98 < 0x100; local_98 = local_98 + 1) {
      pvVar5 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&texture,(long)local_98);
      bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                        ((ShaderImageLoadStoreBase *)this,pvVar5,(uvec4 *)src_vs,
                         write_value_local._4_4_);
      if (!bVar1) {
        glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,(GLuint *)&i);
        glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
        glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
        pvVar5 = std::
                 vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                               *)&texture,(long)local_98);
        tcu::Vector<unsigned_int,_4>::Vector(&local_c8,pvVar5);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                  (&local_b8,(ShaderImageLoadStoreBase *)this,&local_c8);
        uVar6 = std::__cxx11::string::c_str();
        tcu::Vector<unsigned_int,_4>::Vector(&local_f8,(Vector<unsigned_int,_4> *)src_vs);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                  (&local_e8,(ShaderImageLoadStoreBase *)this,&local_f8);
        uVar7 = std::__cxx11::string::c_str();
        ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_118,(ShaderImageLoadStoreBase *)this,write_value_local._4_4_);
        uVar8 = std::__cxx11::string::c_str();
        gl4cts::anon_unknown_0::Output
                  ("Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",uVar6,uVar7,
                   uVar8,(ulong)local_94);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_b8);
        this_local._7_1_ = 0;
        goto LAB_0104362e;
      }
    }
    if (local_94 < 7) {
      location = glu::CallLogWrapper::glGetUniformLocation
                           ((CallLogWrapper *)(this + 8),local_3c,"g_image");
      glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),location,local_94 + 1);
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint   program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, write_value).c_str());
		const int	  kSize   = 16;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture;
		glGenTextures(1, &texture);

		for (GLuint unit = 0; unit < 8; ++unit)
		{
			glBindTexture(GL_TEXTURE_2D, texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);

			glViewport(0, 0, kSize, kSize);
			glUseProgram(program);
			glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
			glBindVertexArray(m_vao);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

			glBindTexture(GL_TEXTURE_2D, texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);

			for (int i = 0; i < kSize * kSize; ++i)
			{
				if (!Equal(data[i], expected_value, internalformat))
				{
					glDeleteTextures(1, &texture);
					glUseProgram(0);
					glDeleteProgram(program);
					Output("Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
						   ToString(data[i]).c_str(), ToString(expected_value).c_str(),
						   FormatEnumToString(internalformat).c_str(), unit);
					return false;
				}
			}

			if (unit < 7)
			{
				glUniform1i(glGetUniformLocation(program, "g_image"), static_cast<GLint>(unit + 1));
			}
		}

		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);

		return true;
	}